

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bcj2.c
# Opt level: O2

void Bcj2Dec_Init(CBcj2Dec *p)

{
  long lVar1;
  
  p->state = 9;
  p->ip = 0;
  *(undefined8 *)(p->temp + 3) = 0;
  *(undefined1 *)((long)&p->code + 3) = 0;
  for (lVar1 = 0x32; lVar1 != 0x134; lVar1 = lVar1 + 1) {
    *(undefined2 *)((long)p->bufs + lVar1 * 2) = 0x400;
  }
  return;
}

Assistant:

void Bcj2Dec_Init(CBcj2Dec *p)
{
  unsigned i;

  p->state = BCJ2_DEC_STATE_OK;
  p->ip = 0;
  p->temp[3] = 0;
  p->range = 0;
  p->code = 0;
  for (i = 0; i < sizeof(p->probs) / sizeof(p->probs[0]); i++)
    p->probs[i] = kBitModelTotal >> 1;
}